

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndLiteralSelector.cpp
# Opt level: O0

LiteralList * __thiscall
Kernel::RndLiteralSelector::getMaximalsInOrder(RndLiteralSelector *this,Clause *c,uint eligible)

{
  List<Kernel::Literal_*> *pLVar1;
  int in_EDX;
  Clause *in_RSI;
  Literal *in_RDI;
  Ordering *unaff_retaddr;
  int li;
  LiteralList *res;
  List<Kernel::Literal_*> **in_stack_ffffffffffffffc8;
  undefined4 local_24;
  Literal *lits;
  
  lits = in_RDI;
  pLVar1 = Lib::List<Kernel::Literal_*>::empty();
  for (local_24 = in_EDX + -1; -1 < local_24; local_24 = local_24 + -1) {
    Clause::operator[](in_RSI,local_24);
    Lib::List<Kernel::Literal_*>::push(in_RDI,in_stack_ffffffffffffffc8);
  }
  Ordering::removeNonMaximal(unaff_retaddr,(LiteralList **)lits);
  return pLVar1;
}

Assistant:

LiteralList* RndLiteralSelector::getMaximalsInOrder(Clause* c, unsigned eligible)
{
  LiteralList* res = LiteralList::empty();

  for(int li=((int)eligible)-1; li>=0; li--) {
    LiteralList::push((*c)[li],res);
  }

  _ord.removeNonMaximal(res);

  return res;
}